

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_ManPrintClasseSizes(Iso_Man_t *p)

{
  int iVar1;
  uint local_28;
  int local_24;
  int Counter;
  int i;
  Iso_Obj_t *pTemp;
  Iso_Obj_t *pIso;
  Iso_Man_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vClasses), local_24 < iVar1; local_24 = local_24 + 1) {
    _Counter = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,local_24);
    local_28 = 0;
    for (; _Counter != (Iso_Obj_t *)0x0; _Counter = Iso_ManObj(p,_Counter->iClass)) {
      local_28 = local_28 + 1;
    }
    printf("%d ",(ulong)local_28);
  }
  printf("\n");
  return;
}

Assistant:

void Iso_ManPrintClasseSizes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i, Counter;
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        Counter = 0;
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
}